

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

int __thiscall
CVmObjIntClsMod::inh_prop
          (CVmObjIntClsMod *this,vm_prop_id_t prop,vm_val_t *val,vm_obj_id_t self,
          vm_obj_id_t orig_target_obj,vm_obj_id_t defining_obj,vm_obj_id_t *source_obj,uint *argc)

{
  int iVar1;
  undefined6 in_register_00000032;
  
  iVar1 = CVmObjTads::search_for_prop_from
                    ((uint)CONCAT62(in_register_00000032,prop),val,orig_target_obj,source_obj,
                     defining_obj);
  return (int)(iVar1 != 0);
}

Assistant:

int CVmObjIntClsMod::inh_prop(VMG_ vm_prop_id_t prop, vm_val_t *val,
                              vm_obj_id_t self,
                              vm_obj_id_t orig_target_obj,
                              vm_obj_id_t defining_obj,
                              vm_obj_id_t *source_obj, uint *argc)
{
    /* 
     *   try finding the property in our property list or a superclass
     *   property list 
     */
    if (search_for_prop_from(vmg_ prop, val, orig_target_obj,
                             source_obj, defining_obj))
        return TRUE;

    /* 
     *   we didn't find it in our list, and we don't want to inherit from any
     *   intrinsic superclass, so we don't have the property 
     */
    return FALSE;
}